

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  sqlite3 *psVar1;
  char *zArg3;
  int iDb_00;
  int iVar2;
  Table *pTVar3;
  char *zArg1;
  Vdbe *p;
  char *zTab;
  char *zDb;
  int code;
  int iDb;
  sqlite3 *db;
  Vdbe *v;
  Table *pTable;
  Trigger *pTrigger_local;
  Parse *pParse_local;
  
  psVar1 = pParse->db;
  iDb_00 = sqlite3SchemaToIndex(pParse->db,pTrigger->pSchema);
  pTVar3 = tableOfTrigger(pTrigger);
  zDb._0_4_ = 0x10;
  zArg3 = psVar1->aDb[iDb_00].zDbSName;
  zArg1 = "sqlite_master";
  if (iDb_00 == 1) {
    zArg1 = "sqlite_temp_master";
    zDb._0_4_ = 0xe;
  }
  iVar2 = sqlite3AuthCheck(pParse,(int)zDb,pTrigger->zName,pTVar3->zName,zArg3);
  if (((iVar2 == 0) && (iVar2 = sqlite3AuthCheck(pParse,9,zArg1,(char *)0x0,zArg3), iVar2 == 0)) &&
     (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'trigger\'",
                       psVar1->aDb[iDb_00].zDbSName,"sqlite_master");
    sqlite3ChangeCookie(pParse,iDb_00);
    sqlite3VdbeAddOp4(p,0x8d,iDb_00,0,0,pTrigger->zName,0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( pTable );
  assert( pTable->pSchema==pTrigger->pSchema || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  assert( pTable!=0 );
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}